

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O0

string * __thiscall
polyscope::SurfaceOneFormTangentVectorQuantity::niceName_abi_cxx11_
          (SurfaceOneFormTangentVectorQuantity *this)

{
  string *in_RDI;
  char *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  
  std::operator+(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string SurfaceOneFormTangentVectorQuantity::niceName() { return name + " (1-form tangent vector)"; }